

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AppTest.cpp
# Opt level: O2

void __thiscall TApp_ExcludesMixedFlags_Test::TestBody(TApp_ExcludesMixedFlags_Test *this)

{
  App *this_00;
  input_t *piVar1;
  bool bVar2;
  Option *opt;
  Option *args;
  Option *this_01;
  long lVar3;
  AssertHelper local_170;
  allocator local_161;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_160 [4];
  string local_140 [32];
  string local_120;
  string local_100;
  string local_e0;
  string local_c0;
  string local_a0;
  string local_80;
  string local_60;
  string local_40;
  
  std::__cxx11::string::string((string *)&local_40,"--opt1",(allocator *)local_160);
  std::__cxx11::string::string((string *)&local_60,"",(allocator *)&local_170);
  this_00 = &(this->super_TApp).app;
  opt = CLI::App::add_flag(this_00,&local_40,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::string((string *)&local_80,"--opt2",(allocator *)local_160);
  std::__cxx11::string::string((string *)&local_a0,"",(allocator *)&local_170);
  CLI::App::add_flag(this_00,&local_80,&local_a0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::string((string *)&local_c0,"--opt3",(allocator *)local_160);
  std::__cxx11::string::string((string *)&local_e0,"",(allocator *)&local_170);
  args = CLI::App::add_flag(this_00,&local_c0,&local_e0);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::string((string *)&local_100,"--no",(allocator *)local_160);
  std::__cxx11::string::string((string *)&local_120,"",(allocator *)&local_170);
  this_01 = CLI::App::add_flag(this_00,&local_100,&local_120);
  CLI::Option::excludes<CLI::Option*,char_const*,CLI::Option*>(this_01,opt,"--opt2",args);
  std::__cxx11::string::~string((string *)&local_120);
  std::__cxx11::string::~string((string *)&local_100);
  TApp::run(&this->super_TApp);
  CLI::App::reset(this_00);
  std::__cxx11::string::string((string *)local_160,"--no",(allocator *)&local_170);
  piVar1 = &(this->super_TApp).args;
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  _M_assign_aux<std::__cxx11::string_const*>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)piVar1,local_160,
             local_140);
  std::__cxx11::string::~string((string *)local_160);
  TApp::run(&this->super_TApp);
  CLI::App::reset(this_00);
  std::__cxx11::string::string((string *)local_160,"--opt2",(allocator *)&local_170);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  _M_assign_aux<std::__cxx11::string_const*>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)piVar1,local_160,
             local_140);
  std::__cxx11::string::~string((string *)local_160);
  TApp::run(&this->super_TApp);
  CLI::App::reset(this_00);
  std::__cxx11::string::string((string *)local_160,"--no",(allocator *)&local_170);
  std::__cxx11::string::string(local_140,"--opt1",&local_161);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  _M_assign_aux<std::__cxx11::string_const*>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)piVar1,local_160,
             &local_120);
  lVar3 = 0x20;
  do {
    std::__cxx11::string::~string((string *)((long)&local_160[0].ptr_ + lVar3));
    lVar3 = lVar3 + -0x20;
  } while (lVar3 != -0x20);
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    TApp::run(&this->super_TApp);
  }
  testing::Message::Message((Message *)local_160);
  testing::internal::AssertHelper::AssertHelper
            (&local_170,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/AppTest.cpp"
             ,0x415,
             "Expected: run() throws an exception of type CLI::ExcludesError.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=(&local_170,(Message *)local_160);
  testing::internal::AssertHelper::~AssertHelper(&local_170);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr(local_160);
  CLI::App::reset(this_00);
  std::__cxx11::string::string((string *)local_160,"--no",(allocator *)&local_170);
  std::__cxx11::string::string(local_140,"--opt2",&local_161);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  _M_assign_aux<std::__cxx11::string_const*>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)piVar1,local_160,
             &local_120);
  lVar3 = 0x20;
  do {
    std::__cxx11::string::~string((string *)((long)&local_160[0].ptr_ + lVar3));
    lVar3 = lVar3 + -0x20;
  } while (lVar3 != -0x20);
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    TApp::run(&this->super_TApp);
  }
  testing::Message::Message((Message *)local_160);
  testing::internal::AssertHelper::AssertHelper
            (&local_170,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/AppTest.cpp"
             ,0x419,
             "Expected: run() throws an exception of type CLI::ExcludesError.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=(&local_170,(Message *)local_160);
  testing::internal::AssertHelper::~AssertHelper(&local_170);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr(local_160);
  return;
}

Assistant:

TEST_F(TApp, ExcludesMixedFlags) {
    CLI::Option *opt1 = app.add_flag("--opt1");
    app.add_flag("--opt2");
    CLI::Option *opt3 = app.add_flag("--opt3");
    app.add_flag("--no")->excludes(opt1, "--opt2", opt3);

    run();

    app.reset();
    args = {"--no"};
    run();

    app.reset();
    args = {"--opt2"};
    run();

    app.reset();
    args = {"--no", "--opt1"};
    EXPECT_THROW(run(), CLI::ExcludesError);

    app.reset();
    args = {"--no", "--opt2"};
    EXPECT_THROW(run(), CLI::ExcludesError);
}